

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.hpp
# Opt level: O3

size_t __thiscall
Diligent::DeviceContextVkImpl::GetDynamicBufferOffset
          (DeviceContextVkImpl *this,BufferVkImpl *pBuffer,bool VerifyAllocation)

{
  pointer pMVar1;
  char (*in_RCX) [19];
  ulong uVar2;
  char (*in_R8) [34];
  ulong uVar3;
  string msg;
  string local_48;
  
  if (pBuffer == (BufferVkImpl *)0x0) {
    FormatString<char[26],char[19]>
              (&local_48,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x8012c9,in_RCX);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"GetDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
               ,0x295);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pBuffer->m_VulkanBuffer).m_VkObject == (VkBuffer_T *)0x0) {
    if (VerifyAllocation) {
      DvpVerifyDynamicAllocation(this,pBuffer);
    }
    uVar3 = (ulong)(pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).m_DynamicBufferId;
    if (uVar3 == 0xffffffff) {
      FormatString<char[17],char_const*,char[34]>
                (&local_48,(Diligent *)"Dynamic buffer \'",
                 (char (*) [17])
                 &(pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  .m_Desc,(char **)"\' does not have dynamic buffer ID",in_R8);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"GetDynamicBufferOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
                 ,0x2a2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    pMVar1 = (this->m_MappedBuffers).
             super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = ((long)(this->m_MappedBuffers).
                   super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 3) *
            -0x3333333333333333;
    if (uVar3 <= uVar2 && uVar2 - uVar3 != 0) {
      return pMVar1[uVar3].Allocation.AlignedOffset;
    }
  }
  return 0;
}

Assistant:

__forceinline size_t DeviceContextVkImpl::GetDynamicBufferOffset(const BufferVkImpl* pBuffer, bool VerifyAllocation)
{
    VERIFY_EXPR(pBuffer != nullptr);

    if (pBuffer->m_VulkanBuffer != VK_NULL_HANDLE)
        return 0;

#ifdef DILIGENT_DEVELOPMENT
    if (VerifyAllocation)
    {
        DvpVerifyDynamicAllocation(pBuffer);
    }
#endif

    const Uint32 DynamicBufferId = pBuffer->GetDynamicBufferId();
    VERIFY(DynamicBufferId != ~0u, "Dynamic buffer '", pBuffer->GetDesc().Name, "' does not have dynamic buffer ID");
    return DynamicBufferId < m_MappedBuffers.size() ?
        m_MappedBuffers[DynamicBufferId].Allocation.AlignedOffset :
        0;
}